

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void write_unsigned<unsigned_long_long>
               (raw_ostream *S,unsigned_long_long N,size_t MinDigits,IntegerStyle Style,
               bool IsNegative)

{
  bool IsNegative_local;
  IntegerStyle Style_local;
  size_t MinDigits_local;
  unsigned_long_long N_local;
  raw_ostream *S_local;
  
  if (N == (N & 0xffffffff)) {
    write_unsigned_impl<unsigned_int>(S,(uint)N,MinDigits,Style,IsNegative);
  }
  else {
    write_unsigned_impl<unsigned_long_long>(S,N,MinDigits,Style,IsNegative);
  }
  return;
}

Assistant:

static void write_unsigned(raw_ostream &S, T N, size_t MinDigits,
                           IntegerStyle Style, bool IsNegative = false) {
  // Output using 32-bit div/mod if possible.
  if (N == static_cast<uint32_t>(N))
    write_unsigned_impl(S, static_cast<uint32_t>(N), MinDigits, Style,
                        IsNegative);
  else
    write_unsigned_impl(S, N, MinDigits, Style, IsNegative);
}